

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O2

Gia_Man_t * Abc_NtkFlattenHierarchyGia(Abc_Ntk_t *pNtk,Vec_Ptr_t **pvBuffers,int fVerbose)

{
  int iVar1;
  Vec_Ptr_t *vBuffers_00;
  Abc_Des_t *pAVar2;
  Abc_Ntk_t *pNtk_00;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *p;
  Gia_Man_t *p_00;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  Vec_Ptr_t *vBuffers;
  
  vBuffers_00 = Vec_PtrAlloc(1000);
  vBuffers = vBuffers_00;
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    iVar6 = pNtk->vPos->nSize + pNtk->vPis->nSize;
    pAVar2 = pNtk->pDesign;
    if (pAVar2 == (Abc_Des_t *)0x0) {
      iVar1 = Gia_ManFlattenLogicPrepare(pNtk);
      uVar7 = iVar1 - iVar6;
    }
    else {
      uVar7 = -iVar6;
      for (iVar6 = 0; iVar6 < pAVar2->vModules->nSize; iVar6 = iVar6 + 1) {
        pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(pAVar2->vModules,iVar6);
        iVar1 = Gia_ManFlattenLogicPrepare(pNtk_00);
        uVar7 = uVar7 + iVar1;
        pAVar2 = pNtk->pDesign;
      }
    }
    pGVar3 = Gia_ManStart(pNtk->vObjs->nSize);
    pcVar4 = Abc_UtilStrsav(pNtk->pName);
    pGVar3->pName = pcVar4;
    pcVar4 = Abc_UtilStrsav(pNtk->pSpec);
    pGVar3->pSpec = pcVar4;
    for (iVar6 = 0; iVar6 < pNtk->vPis->nSize; iVar6 = iVar6 + 1) {
      pAVar5 = Abc_NtkPi(pNtk,iVar6);
      iVar1 = Gia_ManAppendCi(pGVar3);
      (pAVar5->field_6).iTemp = iVar1;
    }
    p = Vec_PtrAlloc(100);
    Gia_ManHashAlloc(pGVar3);
    for (iVar6 = 0; iVar6 < pNtk->vPos->nSize; iVar6 = iVar6 + 1) {
      pAVar5 = Abc_NtkPo(pNtk,iVar6);
      Abc_NtkFlattenHierarchyGia_rec(pGVar3,p,pAVar5,vBuffers_00);
    }
    Gia_ManHashStop(pGVar3);
    Vec_PtrFree(p);
    iVar6 = 0;
    uVar8 = 0;
    if (pNtk->pDesign != (Abc_Des_t *)0x0) {
      uVar8 = (ulong)(pNtk->pDesign->vModules->nSize - 1);
    }
    printf("Hierarchy reader flattened %d instances of boxes and added %d barbufs (out of %d).\n",
           uVar8,(ulong)(uint)vBuffers_00->nSize,(ulong)uVar7);
    for (; iVar6 < pNtk->vPos->nSize; iVar6 = iVar6 + 1) {
      pAVar5 = Abc_NtkPo(pNtk,iVar6);
      Gia_ManAppendCo(pGVar3,(pAVar5->field_6).iTemp);
    }
    if (pvBuffers == (Vec_Ptr_t **)0x0) {
      Vec_PtrFreeP(&vBuffers);
    }
    else {
      *pvBuffers = vBuffers_00;
    }
    p_00 = Gia_ManCleanup(pGVar3);
    Gia_ManStop(pGVar3);
    pGVar3 = Gia_ManSweepHierarchy(p_00);
    Gia_ManStop(p_00);
    return pGVar3;
  }
  __assert_fail("Abc_NtkIsNetlist(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                ,0x1ab,"Gia_Man_t *Abc_NtkFlattenHierarchyGia(Abc_Ntk_t *, Vec_Ptr_t **, int)");
}

Assistant:

Gia_Man_t * Abc_NtkFlattenHierarchyGia( Abc_Ntk_t * pNtk, Vec_Ptr_t ** pvBuffers, int fVerbose )
{
    int fUseBufs = 1;
    Gia_Man_t * pNew, * pTemp; 
    Abc_Ntk_t * pModel;
    Abc_Obj_t * pTerm;
    Vec_Ptr_t * vSupers;
    Vec_Ptr_t * vBuffers = fUseBufs ? Vec_PtrAlloc(1000) : NULL;
    int i, Counter = 0; 
    assert( Abc_NtkIsNetlist(pNtk) );
//    Abc_NtkPrintBoxInfo( pNtk );

    // set the PI/PO numbers
    Counter -= Abc_NtkPiNum(pNtk) + Abc_NtkPoNum(pNtk);
    if ( !pNtk->pDesign )
        Counter += Gia_ManFlattenLogicPrepare( pNtk );
    else
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
            Counter += Gia_ManFlattenLogicPrepare( pModel );

    // start the manager
    pNew = Gia_ManStart( Abc_NtkObjNumMax(pNtk) );
    pNew->pName = Abc_UtilStrsav(pNtk->pName);
    pNew->pSpec = Abc_UtilStrsav(pNtk->pSpec);

    // create PIs and buffers
    Abc_NtkForEachPi( pNtk, pTerm, i )
        pTerm->iTemp = Gia_ManAppendCi( pNew );

    // call recursively
    vSupers = Vec_PtrAlloc( 100 );
    Gia_ManHashAlloc( pNew );
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Abc_NtkFlattenHierarchyGia_rec( pNew, vSupers, pTerm, vBuffers );
    Gia_ManHashStop( pNew );
    Vec_PtrFree( vSupers );
    printf( "Hierarchy reader flattened %d instances of boxes and added %d barbufs (out of %d).\n", 
        pNtk->pDesign ? Vec_PtrSize(pNtk->pDesign->vModules)-1 : 0, Vec_PtrSize(vBuffers), Counter );

    // create buffers and POs
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Gia_ManAppendCo( pNew, pTerm->iTemp );

    if ( pvBuffers )
        *pvBuffers = vBuffers;
    else
        Vec_PtrFreeP( &vBuffers );

    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
//    Gia_ManPrintStats( pNew, NULL );
    pNew = Gia_ManSweepHierarchy( pTemp = pNew );
    Gia_ManStop( pTemp );
//    Gia_ManPrintStats( pNew, NULL );
    return pNew;
}